

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mnist-common.cpp
# Opt level: O3

int wasm_random_digit(char *digitPtr)

{
  int iVar1;
  time_t tVar2;
  bool bVar3;
  ifstream fin;
  long local_220 [4];
  byte abStack_200 [488];
  
  std::ifstream::ifstream(local_220,"t10k-images-idx3-ubyte",_S_bin);
  bVar3 = (abStack_200[*(long *)(local_220[0] + -0x18)] & 5) != 0;
  if (bVar3) {
    wasm_random_digit_cold_1();
  }
  else {
    tVar2 = time((time_t *)0x0);
    srand((uint)tVar2);
    iVar1 = rand();
    std::istream::seekg(local_220,(long)(iVar1 * 0x310 + (iVar1 / 10000) * -0x77a100 + 0x10),0);
    std::istream::read((char *)local_220,(long)digitPtr);
  }
  std::ifstream::~ifstream(local_220);
  return (uint)!bVar3;
}

Assistant:

int wasm_random_digit(char * digitPtr) {
    auto fin = std::ifstream("t10k-images-idx3-ubyte", std::ios::binary);
    if (!fin) {
        fprintf(stderr, "failed to open digits file\n");
        return 0;
    }
    srand(time(NULL));

    // Seek to a random digit: 16-byte header + 28*28 * (random 0 - 10000)
    fin.seekg(16 + MNIST_NINPUT * (rand() % MNIST_NTEST));
    fin.read(digitPtr, MNIST_NINPUT);

    return 1;
}